

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

bitset<256UL> *
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<256UL>,_void>
::as(bitset<256UL> *__return_storage_ptr__,
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  _WordT *p_Var1;
  type_conflict9 tVar2;
  bool bVar3;
  byte bVar4;
  unsigned_long uVar5;
  byte *pbVar6;
  conv_error *pcVar7;
  error_category *peVar8;
  byte bVar9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_00;
  ulong uVar10;
  ulong __n;
  error_code ec;
  error_code ec_00;
  error_code ec_01;
  string_view_type sVar11;
  type tVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  
  tVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
          is_integer<unsigned_long>(j);
  if (tVar2) {
    uVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>(j);
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = uVar5;
  }
  else {
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string(j);
    if (!bVar3) {
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(j);
      if (!bVar3) {
        pcVar7 = (conv_error *)__cxa_allocate_exception(0x58);
        peVar8 = conv_error_category();
        ec_00._M_cat = peVar8;
        ec_00._0_8_ = 0x15;
        conv_error::conv_error(pcVar7,ec_00);
        __cxa_throw(pcVar7,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string(j);
    if (bVar3) {
      json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&val,(json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)j,j_00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&bits,&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    else {
      sVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view(j);
      tVar12 = decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (sVar11._M_str,sVar11._M_str + sVar11._M_len,&bits);
      if (tVar12.ec != success) {
        pcVar7 = (conv_error *)__cxa_allocate_exception(0x58);
        peVar8 = conv_error_category();
        ec_01._M_cat = peVar8;
        ec_01._0_8_ = 0x15;
        conv_error::conv_error(pcVar7,ec_01);
        __cxa_throw(pcVar7,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    bVar4 = 0;
    bVar9 = 0;
    __n = 0;
    for (uVar10 = 0; uVar10 != 0x100; uVar10 = uVar10 + 1) {
      if (bVar9 == 0) {
        if ((ulong)((long)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) <= __n) {
          pcVar7 = (conv_error *)__cxa_allocate_exception(0x58);
          peVar8 = conv_error_category();
          ec._M_cat = peVar8;
          ec._0_8_ = 0x15;
          conv_error::conv_error(pcVar7,ec);
          __cxa_throw(pcVar7,&conv_error::typeinfo,conv_error::~conv_error);
        }
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&bits,__n);
        __n = __n + 1;
        bVar4 = *pbVar6;
        bVar9 = 0x80;
      }
      if ((bVar9 & bVar4) != 0) {
        p_Var1 = (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w + (uVar10 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)uVar10 & 0x3f);
      }
      bVar9 = bVar9 >> 1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::bitset<N> as(const Json& j)
        {
            if (j.template is<uint64_t>())
            {
                auto bits = j.template as<uint64_t>();
                std::bitset<N> bs = static_cast<unsigned long long>(bits);
                return bs;
            }
            else if (j.is_byte_string() || j.is_string())
            {
                std::bitset<N> bs;
                std::vector<uint8_t> bits;
                if (j.is_byte_string())
                {
                    bits = j.template as<std::vector<uint8_t>>();
                }
                else
                {
                    jsoncons::string_view sv = j.as_string_view();
                    auto result = decode_base16(sv.begin(), sv.end(), bits);
                    if (result.ec != conv_errc::success)
                    {
                        JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                    }
                }
                std::uint8_t byte = 0;
                std::uint8_t mask  = 0;

                std::size_t pos = 0;
                for (std::size_t i = 0; i < N; ++i)
                {
                    if (mask == 0)
                    {
                        if (pos >= bits.size())
                        {
                            JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                        }
                        byte = bits.at(pos++);
                        mask = 0x80;
                    }

                    if (byte & mask)
                    {
                        bs[i] = 1;
                    }

                    mask = static_cast<std::uint8_t>(mask >> 1);
                }
                return bs;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_bitset));
            }
        }